

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void * add234_internal(tree234 *t,void *e,int index)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  node234_conflict *n;
  node234_conflict *pnVar5;
  node234 *pnVar6;
  node234 *pnVar7;
  ulong uVar8;
  node234_conflict *pnVar9;
  node234_conflict *pnVar10;
  node234_conflict *n_00;
  tree234 *ptVar11;
  int local_4c;
  void *local_48;
  
  if (t->root == (node234 *)0x0) {
    pnVar5 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar5;
    pnVar5->elems[2] = (void *)0x0;
    t->root->elems[1] = (void *)0x0;
    t->root->kids[1] = (node234 *)0x0;
    t->root->kids[0] = (node234 *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->parent = (node234_conflict *)0x0;
    pnVar5->counts[0] = 0;
    pnVar5->counts[1] = 0;
    pnVar5->counts[2] = 0;
    pnVar5->counts[3] = 0;
    pnVar5->elems[0] = e;
  }
  else {
    uVar8 = 1;
    uVar2 = 2;
    pnVar6 = t->root;
    pnVar5 = (node234 *)0x0;
    ptVar11 = t;
    while (pnVar7 = pnVar6, pnVar7 != (node234 *)0x0) {
      uVar4 = uVar8;
      if (index < 0) {
        iVar3 = (*t->cmp)(e,pnVar7->elems[0]);
        if (iVar3 < 0) {
LAB_00164f4e:
          uVar4 = 0;
        }
        else {
          if (iVar3 == 0) {
            return pnVar7->elems[0];
          }
          if (pnVar7->elems[1] != (void *)0x0) {
            iVar3 = (*t->cmp)(e,pnVar7->elems[1]);
            if (-1 < iVar3) {
              if (iVar3 == 0) {
                return pnVar7->elems[1];
              }
              uVar4 = uVar2;
              if (pnVar7->elems[2] != (void *)0x0) {
                iVar3 = (*t->cmp)(e,pnVar7->elems[2]);
                if ((-1 < iVar3) && (uVar4 = 3, iVar3 == 0)) {
                  return pnVar7->elems[2];
                }
              }
            }
          }
        }
      }
      else if (pnVar7->kids[0] == (node234 *)0x0) {
        uVar4 = (ulong)(uint)index;
      }
      else {
        if (index <= pnVar7->counts[0]) goto LAB_00164f4e;
        index = index + ~pnVar7->counts[0];
        if (pnVar7->counts[1] < index) {
          index = index + ~pnVar7->counts[1];
          uVar4 = uVar2;
          if ((pnVar7->counts[2] < index) &&
             (index = index + ~pnVar7->counts[2], uVar4 = 3, pnVar7->counts[3] < index)) {
            return (void *)0x0;
          }
        }
      }
      ptVar11 = (tree234 *)(pnVar7->kids + uVar4);
      pnVar5 = pnVar7;
      pnVar6 = ptVar11->root;
    }
    local_4c = 0;
    iVar3 = 0;
    pnVar9 = (node234_conflict *)0x0;
    pnVar10 = (node234_conflict *)0x0;
    local_48 = e;
    while (n_00 = pnVar5, n_00 != (node234_conflict *)0x0) {
      pvVar1 = n_00->elems[1];
      if (pvVar1 == (void *)0x0) {
        if (ptVar11 == (tree234 *)n_00->kids) {
          n_00->kids[2] = n_00->kids[1];
          n_00->counts[2] = n_00->counts[1];
          n_00->elems[1] = n_00->elems[0];
          n_00->kids[1] = pnVar9;
          n_00->counts[1] = iVar3;
          n_00->elems[0] = local_48;
          n_00->kids[0] = pnVar10;
          n_00->counts[0] = local_4c;
        }
        else {
          n_00->kids[2] = pnVar9;
          n_00->counts[2] = iVar3;
          n_00->elems[1] = local_48;
          n_00->kids[1] = pnVar10;
          n_00->counts[1] = local_4c;
          pnVar9 = pnVar10;
          pnVar10 = n_00->kids[0];
        }
        if (pnVar10 != (node234_conflict *)0x0) {
          pnVar10->parent = n_00;
          pnVar9 = n_00->kids[1];
        }
        if (pnVar9 != (node234_conflict *)0x0) {
          pnVar9->parent = n_00;
        }
        pnVar6 = n_00->kids[2];
LAB_001654a0:
        if (pnVar6 != (node234 *)0x0) {
          pnVar6->parent = n_00;
        }
        while (pnVar5 = n_00->parent, pnVar5 != (node234_conflict *)0x0) {
          iVar3 = countnode234(n_00);
          if (pnVar5->kids[0] == n_00) {
            uVar8 = 0;
          }
          else {
            uVar8 = 1;
            if (pnVar5->kids[1] != n_00) {
              uVar8 = (ulong)(pnVar5->kids[2] == n_00) ^ 3;
            }
          }
          pnVar5->counts[uVar8] = iVar3;
          n_00 = pnVar5;
        }
        return e;
      }
      if (n_00->elems[2] == (void *)0x0) {
        if (ptVar11 == (tree234 *)n_00->kids) {
          n_00->elems[2] = pvVar1;
          pnVar6 = n_00->kids[2];
          n_00->kids[2] = n_00->kids[1];
          n_00->kids[3] = pnVar6;
          *(undefined8 *)(n_00->counts + 2) = *(undefined8 *)(n_00->counts + 1);
          n_00->elems[1] = n_00->elems[0];
          n_00->kids[1] = pnVar9;
          n_00->counts[1] = iVar3;
          n_00->elems[0] = local_48;
          n_00->kids[0] = pnVar10;
          n_00->counts[0] = local_4c;
        }
        else {
          if (ptVar11 == (tree234 *)(n_00->kids + 1)) {
            n_00->kids[3] = n_00->kids[2];
            n_00->counts[3] = n_00->counts[2];
            n_00->elems[2] = pvVar1;
            n_00->kids[2] = pnVar9;
            n_00->counts[2] = iVar3;
            n_00->elems[1] = local_48;
            n_00->kids[1] = pnVar10;
            n_00->counts[1] = local_4c;
          }
          else {
            n_00->kids[3] = pnVar9;
            n_00->counts[3] = iVar3;
            n_00->elems[2] = local_48;
            n_00->kids[2] = pnVar10;
            n_00->counts[2] = local_4c;
          }
          pnVar10 = n_00->kids[0];
        }
        if (pnVar10 != (node234_conflict *)0x0) {
          pnVar10->parent = n_00;
        }
        if (n_00->kids[1] != (node234 *)0x0) {
          n_00->kids[1]->parent = n_00;
        }
        if (n_00->kids[2] != (node234 *)0x0) {
          n_00->kids[2]->parent = n_00;
        }
        pnVar6 = n_00->kids[3];
        goto LAB_001654a0;
      }
      n = (node234_conflict *)safemalloc(1,0x50,0);
      n->parent = n_00->parent;
      if (ptVar11 == (tree234 *)n_00->kids) {
        n->kids[0] = pnVar10;
        n->counts[0] = local_4c;
        n->elems[0] = local_48;
        n->kids[1] = pnVar9;
        n->counts[1] = iVar3;
        n->elems[1] = n_00->elems[0];
        n->kids[2] = n_00->kids[1];
        n->counts[2] = n_00->counts[1];
LAB_001650eb:
        local_48 = n_00->elems[1];
        n_00->elems[0] = n_00->elems[2];
        pnVar6 = n_00->kids[3];
        n_00->kids[0] = n_00->kids[2];
        n_00->kids[1] = pnVar6;
        *(undefined8 *)n_00->counts = *(undefined8 *)(n_00->counts + 2);
      }
      else {
        if (ptVar11 == (tree234 *)(n_00->kids + 1)) {
          n->kids[0] = n_00->kids[0];
          n->counts[0] = n_00->counts[0];
          n->elems[0] = n_00->elems[0];
          n->kids[1] = pnVar10;
          n->counts[1] = local_4c;
          n->elems[1] = local_48;
          n->kids[2] = pnVar9;
          n->counts[2] = iVar3;
          goto LAB_001650eb;
        }
        n->kids[0] = n_00->kids[0];
        n->counts[0] = n_00->counts[0];
        n->elems[0] = n_00->elems[0];
        n->kids[1] = n_00->kids[1];
        n->counts[1] = n_00->counts[1];
        n->elems[1] = n_00->elems[1];
        if (ptVar11 == (tree234 *)(n_00->kids + 2)) {
          n->kids[2] = pnVar10;
          n->counts[2] = local_4c;
          n_00->kids[0] = pnVar9;
          n_00->counts[0] = iVar3;
          n_00->elems[0] = n_00->elems[2];
          n_00->kids[1] = n_00->kids[3];
          n_00->counts[1] = n_00->counts[3];
        }
        else {
          n->kids[2] = n_00->kids[2];
          n->counts[2] = n_00->counts[2];
          n_00->kids[0] = pnVar10;
          n_00->counts[0] = local_4c;
          n_00->elems[0] = local_48;
          n_00->kids[1] = pnVar9;
          n_00->counts[1] = iVar3;
          local_48 = n_00->elems[2];
        }
      }
      n_00->kids[2] = (node234 *)0x0;
      n_00->kids[3] = (node234 *)0x0;
      n->kids[3] = (node234 *)0x0;
      n_00->counts[2] = 0;
      n_00->counts[3] = 0;
      n->counts[3] = 0;
      n_00->elems[1] = (void *)0x0;
      n_00->elems[2] = (void *)0x0;
      n->elems[2] = (void *)0x0;
      if (n->kids[0] != (node234 *)0x0) {
        n->kids[0]->parent = n;
      }
      if (n->kids[1] != (node234 *)0x0) {
        n->kids[1]->parent = n;
      }
      if (n->kids[2] != (node234 *)0x0) {
        n->kids[2]->parent = n;
      }
      pnVar6 = n_00->kids[0];
      if (pnVar6 != (node234 *)0x0) {
        pnVar6->parent = n_00;
      }
      if (n_00->kids[1] != (node234 *)0x0) {
        n_00->kids[1]->parent = n_00;
      }
      local_4c = countnode234(n);
      iVar3 = countnode234(n_00);
      pnVar5 = n_00->parent;
      pnVar9 = n_00;
      pnVar10 = n;
      if (((pnVar5 != (node234_conflict *)0x0) &&
          (ptVar11 = (tree234 *)pnVar5->kids, pnVar5->kids[0] != n_00)) &&
         (ptVar11 = (tree234 *)(pnVar5->kids + 1), pnVar5->kids[1] != n_00)) {
        ptVar11 = (tree234 *)(pnVar5->kids + 3);
        if (pnVar5->kids[2] == n_00) {
          ptVar11 = (tree234 *)(pnVar5->kids + 2);
        }
      }
    }
    pnVar5 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar5;
    pnVar5->kids[0] = pnVar10;
    pnVar5 = t->root;
    pnVar5->counts[0] = local_4c;
    pnVar5->elems[0] = local_48;
    t->root->kids[1] = pnVar9;
    pnVar5 = t->root;
    pnVar5->counts[1] = iVar3;
    pnVar5->elems[1] = (void *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->counts[2] = 0;
    pnVar5->elems[2] = (void *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->counts[3] = 0;
    pnVar5->parent = (node234_conflict *)0x0;
    if (pnVar5->kids[0] != (node234 *)0x0) {
      pnVar5->kids[0]->parent = pnVar5;
    }
    if (pnVar5->kids[1] != (node234 *)0x0) {
      pnVar5->kids[1]->parent = pnVar5;
    }
  }
  return e;
}

Assistant:

static void *add234_internal(tree234 * t, void *e, int index)
{
    node234 *n, **np, *left, *right;
    void *orig_e = e;
    int c, lcount, rcount;

    LOG(("adding node %p to tree %p\n", e, t));
    if (t->root == NULL) {
        t->root = snew(node234);
        t->root->elems[1] = t->root->elems[2] = NULL;
        t->root->kids[0] = t->root->kids[1] = NULL;
        t->root->kids[2] = t->root->kids[3] = NULL;
        t->root->counts[0] = t->root->counts[1] = 0;
        t->root->counts[2] = t->root->counts[3] = 0;
        t->root->parent = NULL;
        t->root->elems[0] = e;
        LOG(("  created root %p\n", t->root));
        return orig_e;
    }

    n = NULL; /* placate gcc; will always be set below since t->root != NULL */
    np = &t->root;
    while (*np) {
        int childnum;
        n = *np;
        LOG(("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        if (index >= 0) {
            if (!n->kids[0]) {
                /*
                 * Leaf node. We want to insert at kid position
                 * equal to the index:
                 *
                 *   0 A 1 B 2 C 3
                 */
                childnum = index;
            } else {
                /*
                 * Internal node. We always descend through it (add
                 * always starts at the bottom, never in the
                 * middle).
                 */
                do {                   /* this is a do ... while (0) to allow `break' */
                    if (index <= n->counts[0]) {
                        childnum = 0;
                        break;
                    }
                    index -= n->counts[0] + 1;
                    if (index <= n->counts[1]) {
                        childnum = 1;
                        break;
                    }
                    index -= n->counts[1] + 1;
                    if (index <= n->counts[2]) {
                        childnum = 2;
                        break;
                    }
                    index -= n->counts[2] + 1;
                    if (index <= n->counts[3]) {
                        childnum = 3;
                        break;
                    }
                    return NULL;       /* error: index out of range */
                } while (0);
            }
        } else {
            if ((c = t->cmp(e, n->elems[0])) < 0)
                childnum = 0;
            else if (c == 0)
                return n->elems[0];    /* already exists */
            else if (n->elems[1] == NULL
                     || (c = t->cmp(e, n->elems[1])) < 0) childnum = 1;
            else if (c == 0)
                return n->elems[1];    /* already exists */
            else if (n->elems[2] == NULL
                     || (c = t->cmp(e, n->elems[2])) < 0) childnum = 2;
            else if (c == 0)
                return n->elems[2];    /* already exists */
            else
                childnum = 3;
        }
        np = &n->kids[childnum];
        LOG(("  moving to child %d (%p)\n", childnum, *np));
    }

    /*
     * We need to insert the new element in n at position np.
     */
    left = NULL;
    lcount = 0;
    right = NULL;
    rcount = 0;
    while (n) {
        LOG(("  at %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        LOG(("  need to insert %p/%d [%p] %p/%d at position %d\n",
             left, lcount, e, right, rcount, (int)(np - n->kids)));
        if (n->elems[1] == NULL) {
            /*
             * Insert in a 2-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 2-node\n"));
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else {                   /* np == &n->kids[1] */
                LOG(("  inserting on right of 2-node\n"));
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            LOG(("  done\n"));
            break;
        } else if (n->elems[2] == NULL) {
            /*
             * Insert in a 3-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else if (np == &n->kids[1]) {
                LOG(("  inserting in middle of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            } else {                   /* np == &n->kids[2] */
                LOG(("  inserting on right of 3-node\n"));
                n->kids[3] = right;
                n->counts[3] = rcount;
                n->elems[2] = e;
                n->kids[2] = left;
                n->counts[2] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            if (n->kids[3])
                n->kids[3]->parent = n;
            LOG(("  done\n"));
            break;
        } else {
            node234 *m = snew(node234);
            m->parent = n->parent;
            LOG(("  splitting a 4-node; created new node %p\n", m));
            /*
             * Insert in a 4-node; split into a 2-node and a
             * 3-node, and move focus up a level.
             *
             * I don't think it matters which way round we put the
             * 2 and the 3. For simplicity, we'll put the 3 first
             * always.
             */
            if (np == &n->kids[0]) {
                m->kids[0] = left;
                m->counts[0] = lcount;
                m->elems[0] = e;
                m->kids[1] = right;
                m->counts[1] = rcount;
                m->elems[1] = n->elems[0];
                m->kids[2] = n->kids[1];
                m->counts[2] = n->counts[1];
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[1]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = left;
                m->counts[1] = lcount;
                m->elems[1] = e;
                m->kids[2] = right;
                m->counts[2] = rcount;
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[2]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = left;
                m->counts[2] = lcount;
                /* e = e; */
                n->kids[0] = right;
                n->counts[0] = rcount;
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else {                   /* np == &n->kids[3] */
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = n->kids[2];
                m->counts[2] = n->counts[2];
                n->kids[0] = left;
                n->counts[0] = lcount;
                n->elems[0] = e;
                n->kids[1] = right;
                n->counts[1] = rcount;
                e = n->elems[2];
            }
            m->kids[3] = n->kids[3] = n->kids[2] = NULL;
            m->counts[3] = n->counts[3] = n->counts[2] = 0;
            m->elems[2] = n->elems[2] = n->elems[1] = NULL;
            if (m->kids[0])
                m->kids[0]->parent = m;
            if (m->kids[1])
                m->kids[1]->parent = m;
            if (m->kids[2])
                m->kids[2]->parent = m;
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            LOG(("  left (%p): %p/%d [%p] %p/%d [%p] %p/%d\n", m,
                 m->kids[0], m->counts[0], m->elems[0],
                 m->kids[1], m->counts[1], m->elems[1],
                 m->kids[2], m->counts[2]));
            LOG(("  right (%p): %p/%d [%p] %p/%d\n", n,
                 n->kids[0], n->counts[0], n->elems[0],
                 n->kids[1], n->counts[1]));
            left = m;
            lcount = countnode234(left);
            right = n;
            rcount = countnode234(right);
        }
        if (n->parent)
            np = (n->parent->kids[0] == n ? &n->parent->kids[0] :
                  n->parent->kids[1] == n ? &n->parent->kids[1] :
                  n->parent->kids[2] == n ? &n->parent->kids[2] :
                  &n->parent->kids[3]);
        n = n->parent;
    }

    /*
     * If we've come out of here by `break', n will still be
     * non-NULL and all we need to do is go back up the tree
     * updating counts. If we've come here because n is NULL, we
     * need to create a new root for the tree because the old one
     * has just split into two. */
    if (n) {
        while (n->parent) {
            int count = countnode234(n);
            int childnum;
            childnum = (n->parent->kids[0] == n ? 0 :
                        n->parent->kids[1] == n ? 1 :
                        n->parent->kids[2] == n ? 2 : 3);
            n->parent->counts[childnum] = count;
            n = n->parent;
        }
    } else {
        LOG(("  root is overloaded, split into two\n"));
        t->root = snew(node234);
        t->root->kids[0] = left;
        t->root->counts[0] = lcount;
        t->root->elems[0] = e;
        t->root->kids[1] = right;
        t->root->counts[1] = rcount;
        t->root->elems[1] = NULL;
        t->root->kids[2] = NULL;
        t->root->counts[2] = 0;
        t->root->elems[2] = NULL;
        t->root->kids[3] = NULL;
        t->root->counts[3] = 0;
        t->root->parent = NULL;
        if (t->root->kids[0])
            t->root->kids[0]->parent = t->root;
        if (t->root->kids[1])
            t->root->kids[1]->parent = t->root;
        LOG(("  new root is %p/%d [%p] %p/%d\n",
             t->root->kids[0], t->root->counts[0],
             t->root->elems[0], t->root->kids[1], t->root->counts[1]));
    }

    return orig_e;
}